

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::anon_unknown_0::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::
TestBody(VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test *this)

{
  FieldDescriptor *field;
  KeyValue *pKVar1;
  byte bVar2;
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> this_00;
  Descriptor *pDVar3;
  long lVar4;
  bool bVar5;
  CppStringType CVar6;
  int iVar7;
  FieldDescriptor *pFVar8;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pRVar9;
  RepeatedPtrFieldBase *pRVar10;
  RepeatedPtrField<google::protobuf::Message> *pRVar11;
  MapFieldBase *this_01;
  Descriptor *this_02;
  ExtensionSet *pEVar12;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  Reflection *this_03;
  long lVar13;
  KeyValue *pKVar14;
  char *message;
  KeyValue *pKVar15;
  uint uVar16;
  long lVar17;
  string_view str;
  string_view str_00;
  Metadata MVar18;
  Descriptor *extendee;
  undefined1 local_108 [8];
  _Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false> _Stack_100;
  FieldDescriptor *local_f8;
  FieldDescriptor *pFStack_f0;
  FieldDescriptor *local_e8;
  MapFieldBase *pMStack_e0;
  undefined1 local_cd;
  undefined1 auStack_cc [44];
  FieldDescriptor *local_a0;
  MapFieldBase *local_98;
  VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test *local_90;
  uint32_t *local_88;
  ReflectionSchema *local_80;
  long local_78;
  MapDynamicFieldInfo<google::protobuf::Message> local_70;
  DescriptorPool *local_40;
  DescriptorNames local_38;
  
  this_00._M_head_impl = (LogMessageData *)(this->super_VisitFieldsTest).message_;
  auStack_cc._0_4_ = 0xffffffff;
  MVar18 = Message::GetMetadata((Message *)this_00._M_head_impl);
  this_03 = MVar18.reflection;
  if (0 < (this_03->schema_).weak_field_map_offset_) {
LAB_008ed7c4:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
               ,99,"!schema.HasWeakFields()");
    str_00._M_str = "weak fields are not supported";
    str_00._M_len = 0x1d;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
              ((LogMessage *)local_108,str_00);
LAB_008ed885:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)local_108);
  }
  local_90 = this;
  if ((this_03->schema_).has_bits_offset_ == -1) {
    auStack_cc._4_8_ = (uint32_t *)0x0;
  }
  else {
    auStack_cc._4_8_ = Reflection::GetHasBits(this_03,(Message *)this_00._M_head_impl);
  }
  pDVar3 = this_03->descriptor_;
  local_78 = (long)pDVar3->field_count_;
  if (0 < local_78) {
    local_80 = &this_03->schema_;
    local_88 = (this_03->schema_).has_bit_indices_;
    lVar17 = 0;
    lVar13 = 0;
    do {
      if (pDVar3->field_count_ <= lVar13) {
        internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
LAB_008ed775:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields.h"
                   ,0x6e,"!field->options().weak()");
        str._M_str = "weak fields are not supported";
        str._M_len = 0x1d;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  ((LogMessage *)local_108,str);
        goto LAB_008ed885;
      }
      pFVar8 = pDVar3->fields_;
      if (*(char *)(*(long *)((long)&pFVar8->options_ + lVar17) + 0x87) == '\x01')
      goto LAB_008ed775;
      if ((auStack_cc._0_4_ != 0xffffffff) &&
         (((uint)auStack_cc._0_4_ >>
           (*(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar8->type_)[lVar17] * 4) &
           0x1f) & 1) == 0)) goto LAB_008ed425;
      bVar2 = (&pFVar8->field_0x1)[lVar17];
      if (0xbf < bVar2 != (bool)((bVar2 & 0x20) >> 5)) {
        internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
        goto LAB_008ed7c4;
      }
      field = (FieldDescriptor *)(&pFVar8->super_SymbolBase + lVar17);
      if ((bVar2 & 0x20) == 0) {
        bVar5 = ReflectionSchema::InRealOneof(local_80,field);
        if (bVar5) {
          lVar4 = *(long *)((long)&pFVar8->scope_ + lVar17);
          if (lVar4 == 0) {
            protobuf_assumption_failed
                      ("res != nullptr",
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb31);
          }
          if ((ulong)*(uint *)((long)&((this_00._M_head_impl)->entry).full_filename_._M_len +
                              (long)((int)((ulong)(lVar4 - *(long *)(*(long *)(lVar4 + 0x10) + 0x48)
                                                  ) >> 3) * -0x49249249) * 4 +
                              (ulong)(uint)(this_03->schema_).oneof_case_offset_) !=
              (long)*(int *)((long)&pFVar8->number_ + lVar17)) goto LAB_008ed425;
          switch((&pFVar8->type_)[lVar17]) {
          case '\t':
          case '\f':
            CVar6 = FieldDescriptor::cpp_string_type(field);
            if (((CVar6 != kView) && (CVar6 != kString)) && (CVar6 != kCord)) break;
          case '\x01':
          case '\x02':
          case '\x03':
          case '\x04':
          case '\x05':
          case '\x06':
          case '\a':
          case '\b':
          case '\r':
          case '\x0e':
          case '\x0f':
          case '\x10':
          case '\x11':
          case '\x12':
            Reflection::ClearOneofField(this_03,(Message *)this_00._M_head_impl,field);
            break;
          case '\n':
          case '\v':
            goto switchD_008ed111_caseD_a;
          default:
            goto switchD_008ed111_default;
          }
        }
        else if (((uint32_t *)auStack_cc._4_8_ == (uint32_t *)0x0) ||
                (uVar16 = local_88[lVar13], uVar16 == 0xffffffff)) {
          bVar5 = Reflection::HasFieldSingular(this_03,(Message *)this_00._M_head_impl,field);
          if (bVar5) goto LAB_008ed15e;
        }
        else if ((*(uint *)(auStack_cc._4_8_ + (ulong)(uVar16 >> 5) * 4) >> (uVar16 & 0x1f) & 1) !=
                 0) {
LAB_008ed15e:
          switch((&pFVar8->type_)[lVar17]) {
          case '\x01':
          case '\x02':
          case '\x03':
          case '\x04':
          case '\x05':
          case '\x06':
          case '\a':
          case '\b':
          case '\n':
          case '\v':
          case '\r':
          case '\x0e':
          case '\x0f':
          case '\x10':
          case '\x11':
          case '\x12':
            break;
          case '\t':
          case '\f':
            CVar6 = FieldDescriptor::cpp_string_type(field);
            if (((CVar6 != kView) && (CVar6 != kString)) && (CVar6 != kCord)) goto LAB_008ed425;
            break;
          default:
            goto switchD_008ed17d_default;
          }
switchD_008ed111_caseD_a:
          Reflection::ClearField(this_03,(Message *)this_00._M_head_impl,field);
        }
      }
      else {
        switch((&pFVar8->type_)[lVar17]) {
        case '\x01':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<double>>
                             (this_03,(Message *)this_00._M_head_impl,field);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_00._M_head_impl;
            local_f8 = field;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_double> *)
                       local_108);
          }
          break;
        case '\x02':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<float>>
                             (this_03,(Message *)this_00._M_head_impl,field);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_00._M_head_impl;
            local_f8 = field;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_float> *)
                       local_108);
          }
          break;
        case '\x03':
        case '\x10':
        case '\x12':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<long>>
                             (this_03,(Message *)this_00._M_head_impl,field);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_00._M_head_impl;
            local_f8 = field;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_long> *)
                       local_108);
          }
          break;
        case '\x04':
        case '\x06':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_long>>
                             (this_03,(Message *)this_00._M_head_impl,field);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_00._M_head_impl;
            local_f8 = field;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_long>
                        *)local_108);
          }
          break;
        case '\x05':
        case '\x0e':
        case '\x0f':
        case '\x11':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<int>>
                             (this_03,(Message *)this_00._M_head_impl,field);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_00._M_head_impl;
            local_f8 = field;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_int> *)
                       local_108);
          }
          break;
        case '\a':
        case '\r':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<unsigned_int>>
                             (this_03,(Message *)this_00._M_head_impl,field);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_00._M_head_impl;
            local_f8 = field;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_unsigned_int>
                        *)local_108);
          }
          break;
        case '\b':
          pFVar8 = (FieldDescriptor *)
                   Reflection::GetRawNonOneof<google::protobuf::RepeatedField<bool>>
                             (this_03,(Message *)this_00._M_head_impl,field);
          iVar7 = SooRep::size((SooRep *)pFVar8,
                               (undefined1  [16])
                               ((undefined1  [16])
                                *(anon_union_16_2_b9f6da03_for_SooRep_0 *)&pFVar8->super_SymbolBase
                               & (undefined1  [16])0x4) == (undefined1  [16])0x0);
          if (iVar7 != 0) {
            local_108 = (undefined1  [8])this_03;
            _Stack_100._M_head_impl = this_00._M_head_impl;
            local_f8 = field;
            pFStack_f0 = pFVar8;
            RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool>::Clear
                      ((RepeatedEntityDynamicFieldInfoBase<google::protobuf::Message,_bool> *)
                       local_108);
          }
          break;
        case '\t':
        case '\f':
          CVar6 = FieldDescriptor::cpp_string_type(field);
          if ((CVar6 - kView < 3) &&
             (pRVar9 = Reflection::
                       GetRawNonOneof<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                                 (this_03,(Message *)this_00._M_head_impl,field),
             (pRVar9->super_RepeatedPtrFieldBase).current_size_ != 0)) {
            pRVar10 = (RepeatedPtrFieldBase *)
                      Reflection::MutableRawRepeatedString
                                (this_03,(Message *)this_00._M_head_impl,field,true);
            RepeatedPtrFieldBase::
            Clear<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(pRVar10);
          }
          break;
        case '\n':
LAB_008ed2f7:
          pRVar11 = Reflection::
                    GetRawNonOneof<google::protobuf::RepeatedPtrField<google::protobuf::Message>>
                              (this_03,(Message *)this_00._M_head_impl,field);
          if ((pRVar11->super_RepeatedPtrFieldBase).current_size_ != 0) {
            pRVar10 = (RepeatedPtrFieldBase *)
                      Reflection::MutableRawRepeatedField
                                (this_03,(Message *)this_00._M_head_impl,field,CPPTYPE_MESSAGE,-1,
                                 (Descriptor *)0x0);
            RepeatedPtrFieldBase::
            Clear<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                      (pRVar10);
          }
          break;
        case '\v':
          bVar5 = FieldDescriptor::is_map_message_type(field);
          if (!bVar5) goto LAB_008ed2f7;
          this_01 = Reflection::GetRawNonOneof<google::protobuf::internal::MapFieldBase>
                              (this_03,(Message *)this_00._M_head_impl,field);
          iVar7 = MapFieldBase::size(this_01);
          if (iVar7 != 0) {
            this_02 = FieldDescriptor::message_type(field);
            local_98 = this_01;
            local_a0 = Descriptor::map_key(this_02);
            pFVar8 = Descriptor::map_value(this_02);
            MapDynamicFieldInfo<google::protobuf::Message>::MapDynamicFieldInfo
                      (&local_70,this_03,(Message *)this_00._M_head_impl,field,local_a0,pFVar8,
                       local_98);
            local_e8 = local_70.value;
            pMStack_e0 = local_70.const_map_field;
            local_f8 = local_70.field;
            pFStack_f0 = local_70.key;
            local_108 = (undefined1  [8])local_70.reflection;
            _Stack_100._M_head_impl = (LogMessageData *)local_70.message;
            MapDynamicFieldInfo<google::protobuf::Message>::Clear
                      ((MapDynamicFieldInfo<google::protobuf::Message> *)local_108);
          }
          break;
        default:
          internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
switchD_008ed17d_default:
          internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
switchD_008ed111_default:
          internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_cc + 0xc));
          if (local_70.reflection != (Reflection *)0x0) {
            (**(code **)&(local_70.reflection)->descriptor_->field_count_)();
          }
          if (_Stack_100._M_head_impl != (LogMessageData *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&_Stack_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         _Stack_100._M_head_impl);
          }
          _Unwind_Resume(extraout_RAX);
        }
      }
LAB_008ed425:
      lVar13 = lVar13 + 1;
      lVar17 = lVar17 + 0x58;
    } while (local_78 != lVar13);
  }
  if ((this_03->schema_).extensions_offset_ != -1) {
    pEVar12 = Reflection::MutableExtensionSet(this_03,(Message *)this_00._M_head_impl);
    local_38.payload_ = (char *)this_03->descriptor_;
    auStack_cc._36_8_ = &local_38;
    local_40 = this_03->descriptor_pool_;
    auStack_cc._28_8_ = &local_40;
    auStack_cc._12_8_ = auStack_cc;
    auStack_cc._20_8_ = &local_cd;
    lVar13 = (long)(short)pEVar12->flat_size_;
    pKVar14 = (pEVar12->map_).flat;
    if (lVar13 < 0) {
      internal::_GLOBAL__N_1::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody();
    }
    else {
      lVar17 = lVar13 * 0x20;
      pKVar1 = pKVar14 + lVar13;
      pKVar15 = pKVar14;
      local_108 = (undefined1  [8])auStack_cc._12_8_;
      _Stack_100._M_head_impl = (LogMessageData *)auStack_cc._20_8_;
      local_f8 = (FieldDescriptor *)auStack_cc._28_8_;
      pFStack_f0 = (FieldDescriptor *)auStack_cc._36_8_;
      if (pEVar12->flat_size_ != 0) {
        uVar16 = 0;
        do {
          lVar17 = lVar17 + -0x20;
          ExtensionSet::Extension::PrefetchPtr(&pKVar15->second);
          pKVar15 = pKVar15 + 1;
          if (lVar17 == 0) break;
          bVar5 = uVar16 < 0xf;
          uVar16 = uVar16 + 1;
        } while (bVar5);
      }
      if (pKVar15 != pKVar1) {
        do {
          ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(local_108,pKVar14->first,&pKVar14->second);
          ExtensionSet::Extension::PrefetchPtr(&pKVar15->second);
          pKVar14 = pKVar14 + 1;
          pKVar15 = pKVar15 + 1;
        } while (pKVar15 != pKVar1);
      }
      if (pKVar14 != pKVar1) {
        do {
          ReflectionVisit::
          VisitFields<google::protobuf::Message,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::$_0>(google::protobuf::Message&,google::protobuf::internal::(anonymous_namespace)::VisitFieldsTest_ClearByVisitFieldsMustBeEmpty_Test::TestBody()::$_0&&,google::protobuf::internal::FieldMask)
          ::{lambda(int,auto:1&)#1}::operator()(local_108,pKVar14->first,&pKVar14->second);
          pKVar14 = pKVar14 + 1;
        } while (pKVar14 != pKVar1);
      }
    }
  }
  iVar7 = (*(((local_90->super_VisitFieldsTest).message_)->super_MessageLite)._vptr_MessageLite[3])
                    ();
  local_70.reflection = (Reflection *)CONCAT44(extraout_var,iVar7);
  auStack_cc._12_8_ = auStack_cc._12_8_ & 0xffffffff00000000;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_108,"message_->ByteSizeLong()","0",(unsigned_long *)&local_70,
             (int *)(auStack_cc + 0xc));
  if (local_108[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if ((__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )_Stack_100._M_head_impl ==
        (__uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
         )0x0) {
      message = anon_var_dwarf_a22956 + 5;
    }
    else {
      message = *(char **)_Stack_100._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(auStack_cc + 0xc),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
               ,0x7f,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(auStack_cc + 0xc),(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(auStack_cc + 0xc));
    if (local_70.reflection != (Reflection *)0x0) {
      (**(code **)&(local_70.reflection)->descriptor_->field_count_)();
    }
  }
  if (_Stack_100._M_head_impl != (LogMessageData *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&_Stack_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 _Stack_100._M_head_impl);
  }
  return;
}

Assistant:

TEST_P(VisitFieldsTest, ClearByVisitFieldsMustBeEmpty) {
  VisitFields(*message_, [](auto info) { info.Clear(); });

  EXPECT_EQ(message_->ByteSizeLong(), 0);
}